

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crit.hpp
# Opt level: O2

double find_split_std_gain_t<long_double,float>
                 (float *x,float xmean,size_t *ix_arr,size_t st,size_t end,double *sd_arr,
                 GainCriterion criterion,double min_gain,double *split_point,size_t *split_ix)

{
  longdouble lVar1;
  float fVar2;
  long lVar3;
  size_t sVar4;
  size_t sVar5;
  undefined4 in_register_0000008c;
  long lVar6;
  size_t sVar7;
  longdouble in_ST0;
  longdouble lVar8;
  longdouble lVar9;
  longdouble lVar10;
  longdouble lVar11;
  longdouble lVar12;
  longdouble lVar13;
  float fVar14;
  double dVar15;
  longdouble local_a0;
  
  calc_sd_right_to_left<long_double,float>
            ((longdouble *)x,(float *)ix_arr,xmean,(size_t *)st,end,(size_t)sd_arr,
             (double *)CONCAT44(in_register_0000008c,criterion));
  fVar14 = x[ix_arr[st]];
  lVar3 = (end - st) + 1;
  lVar8 = (longdouble)lVar3 + (longdouble)(float)(&DAT_003250d8)[lVar3 < 0];
  *split_ix = st;
  lVar1 = (longdouble)1;
  lVar12 = (longdouble)0;
  sVar5 = st;
  sVar7 = st;
  lVar11 = lVar12;
  lVar13 = (longdouble)(fVar14 - xmean);
  local_a0 = (longdouble)-INFINITY;
LAB_002649e8:
  lVar3 = end - sVar5;
  sVar4 = sVar5;
  fVar2 = fVar14;
  do {
    if (end <= sVar4) {
      if (local_a0 != (longdouble)-INFINITY) {
        dVar15 = midpoint<float>(x[ix_arr[sVar7]],x[ix_arr[sVar7 + 1]]);
        *split_point = dVar15;
      }
      return (double)local_a0;
    }
    lVar9 = (longdouble)(fVar2 - xmean);
    lVar6 = (sVar4 - st) + 1;
    lVar10 = (longdouble)lVar6 + (longdouble)(float)(&DAT_003250d8)[lVar6 < 0];
    lVar11 = lVar11 + (lVar9 - lVar11) / lVar10;
    lVar12 = (lVar9 - lVar11) * (lVar9 - lVar13) + lVar12;
    fVar14 = x[ix_arr[sVar4 + 1]];
    lVar13 = lVar11;
    if ((fVar2 != fVar14) || (NAN(fVar2) || NAN(fVar14))) {
      lVar9 = (longdouble)0;
      if (sVar4 - st != 0) {
        lVar9 = SQRT(lVar12 / lVar10);
      }
      if (criterion == Pooled) {
        lVar9 = (-lVar1 / in_ST0) *
                ((lVar10 / lVar8) * lVar9 +
                (((longdouble)lVar3 + (longdouble)(float)(&DAT_003250d8)[lVar3 < 0]) / lVar8) *
                (longdouble)sd_arr[(sVar4 + 1) - st]) + lVar1;
      }
      else {
        lVar9 = lVar1 - (lVar9 + (longdouble)sd_arr[(sVar4 + 1) - st]) / (in_ST0 + in_ST0);
      }
      if (local_a0 < lVar9 && (longdouble)min_gain < lVar9) break;
    }
    lVar3 = lVar3 + -1;
    sVar4 = sVar4 + 1;
    fVar2 = fVar14;
  } while( true );
  *split_ix = sVar4;
  sVar5 = sVar4 + 1;
  sVar7 = sVar4;
  local_a0 = lVar9;
  goto LAB_002649e8;
}

Assistant:

double find_split_std_gain_t(real_t_ *restrict x, real_t_ xmean, size_t ix_arr[], size_t st, size_t end, double *restrict sd_arr,
                             GainCriterion criterion, double min_gain, double &restrict split_point, size_t &restrict split_ix)
{
    real_t full_sd = calc_sd_right_to_left<real_t>(x, xmean, ix_arr, st, end, sd_arr);
    real_t running_mean = 0;
    real_t running_ssq = 0;
    real_t mean_prev = x[ix_arr[st]] - xmean;
    real_t best_gain = -HUGE_VAL;
    real_t n = (real_t)(end - st + 1);
    real_t this_sd, this_gain;
    split_ix = st;
    for (size_t row = st; row < end; row++)
    {
        running_mean   += ((x[ix_arr[row]] - xmean) - running_mean) / (real_t)(row-st+1);
        running_ssq    += ((x[ix_arr[row]] - xmean) - running_mean) * ((x[ix_arr[row]] - xmean) - mean_prev);
        mean_prev       =  running_mean;
        if (x[ix_arr[row]] == x[ix_arr[row+1]])
            continue;

        this_sd = (row == st)? 0. : std::sqrt(running_ssq / (real_t)(row-st+1));
        this_gain = (criterion == Pooled)?
                    pooled_gain(full_sd, n, this_sd, sd_arr[row-st+1], row-st+1, end-row)
                        :
                    sd_gain(full_sd, this_sd, sd_arr[row-st+1]);
        if (this_gain > best_gain && this_gain > min_gain)
        {
            best_gain = this_gain;
            split_ix = row;
        }
    }
    
    if (best_gain > -HUGE_VAL)
        split_point = midpoint(x[ix_arr[split_ix]], x[ix_arr[split_ix+1]]);

    return best_gain;
}